

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# combinator.hpp
# Opt level: O1

result<toml::detail::region<std::vector<char,_std::allocator<char>_>_>,_toml::detail::none_t> *
__thiscall
toml::detail::
either<toml::detail::sequence<toml::detail::character<(char)116>,toml::detail::character<(char)114>,toml::detail::character<(char)117>,toml::detail::character<(char)101>>,toml::detail::sequence<toml::detail::character<(char)102>,toml::detail::character<(char)97>,toml::detail::character<(char)108>,toml::detail::character<(char)115>,toml::detail::character<(char)101>>>
::invoke<std::vector<char,std::allocator<char>>>
          (result<toml::detail::region<std::vector<char,_std::allocator<char>_>_>,_toml::detail::none_t>
           *__return_storage_ptr__,
          either<toml::detail::sequence<toml::detail::character<(char)116>,toml::detail::character<(char)114>,toml::detail::character<(char)117>,toml::detail::character<(char)101>>,toml::detail::sequence<toml::detail::character<(char)102>,toml::detail::character<(char)97>,toml::detail::character<(char)108>,toml::detail::character<(char)115>,toml::detail::character<(char)101>>>
          *this,location<std::vector<char,_std::allocator<char>_>_> *loc)

{
  location<std::vector<char,_std::allocator<char>_>_> *loc_00;
  result<toml::detail::region<std::vector<char,_std::allocator<char>_>_>,_toml::detail::none_t> rslt
  ;
  result<toml::detail::region<std::vector<char,_std::allocator<char>_>_>,_toml::detail::none_t>
  local_68;
  
  sequence<toml::detail::character<(char)116>,toml::detail::character<(char)114>,toml::detail::character<(char)117>,toml::detail::character<(char)101>>
  ::invoke<std::vector<char,std::allocator<char>>>
            (&local_68,
             (sequence<toml::detail::character<(char)116>,toml::detail::character<(char)114>,toml::detail::character<(char)117>,toml::detail::character<(char)101>>
              *)this,loc);
  if (local_68.is_ok_ == true) {
    __return_storage_ptr__->is_ok_ = true;
    region<std::vector<char,_std::allocator<char>_>_>::region
              (&(__return_storage_ptr__->field_1).succ.value,&local_68.field_1.succ.value);
  }
  else {
    sequence<toml::detail::character<(char)102>,toml::detail::character<(char)97>,toml::detail::character<(char)108>,toml::detail::character<(char)115>,toml::detail::character<(char)101>>
    ::invoke<std::vector<char,std::allocator<char>>>
              (__return_storage_ptr__,
               (sequence<toml::detail::character<(char)102>,toml::detail::character<(char)97>,toml::detail::character<(char)108>,toml::detail::character<(char)115>,toml::detail::character<(char)101>>
                *)this,loc_00);
  }
  if (local_68.is_ok_ == true) {
    region<std::vector<char,_std::allocator<char>_>_>::~region(&local_68.field_1.succ.value);
  }
  return __return_storage_ptr__;
}

Assistant:

static result<region<Cont>, none_t>
    invoke(location<Cont>& loc)
    {
        static_assert(std::is_same<char, typename Cont::value_type>::value,
                      "internal error: container::value_type should be `char`.");

        const auto rslt = Head::invoke(loc);
        if(rslt.is_ok()) {return rslt;}
        return either<Tail...>::invoke(loc);
    }